

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_file.c
# Opt level: O3

int archive_write_open_FILE(archive *a,FILE *f)

{
  int iVar1;
  undefined8 *client_data;
  
  client_data = (undefined8 *)malloc(8);
  if (client_data != (undefined8 *)0x0) {
    *client_data = f;
    iVar1 = archive_write_open(a,client_data,file_open,file_write,file_close);
    return iVar1;
  }
  archive_set_error(a,0xc,"No memory");
  return -0x1e;
}

Assistant:

int
archive_write_open_FILE(struct archive *a, FILE *f)
{
	struct write_FILE_data *mine;

	mine = (struct write_FILE_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->f = f;
	return (archive_write_open(a, mine,
		    file_open, file_write, file_close));
}